

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

FaceData * __thiscall
Ptex::v2_2::PtexReader::ConstantFace::reduce
          (ConstantFace *this,PtexReader *param_1,Res param_2,ReduceFn *param_3,size_t *newMemUsed)

{
  FaceData *this_00;
  size_t __n;
  
  this_00 = (FaceData *)operator_new(0x18);
  ConstantFace((ConstantFace *)this_00,*(int *)&(this->super_PackedFace).super_FaceData.field_0xc);
  __n = (size_t)*(int *)&(this->super_PackedFace).super_FaceData.field_0xc;
  *newMemUsed = __n + 0x18;
  memcpy(this_00[1].super_PtexFaceData._vptr_PtexFaceData,(this->super_PackedFace)._data,__n);
  return this_00;
}

Assistant:

PtexReader::FaceData* PtexReader::ConstantFace::reduce(PtexReader*, Res, PtexUtils::ReduceFn, size_t& newMemUsed)
{
    // must make a new constant face (even though it's identical to this one)
    // because it will be owned by a different reduction level
    // and will therefore have a different parent
    ConstantFace* pf = new ConstantFace(_pixelsize);
    newMemUsed = sizeof(ConstantFace) + _pixelsize;
    memcpy(pf->_data, _data, _pixelsize);
    return pf;
}